

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch2Approvals.h
# Opt level: O2

void __thiscall
Catch2ApprovalListener::testCaseStarting(Catch2ApprovalListener *this,TestCaseInfo *testInfo)

{
  allocator<char> local_49;
  string local_48;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,(testInfo->lineInfo).file,&local_49);
  ApprovalTests::TestName::setFileName(&this->currentTest,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  ApprovalTests::FrameworkIntegrations::setCurrentTest(&this->currentTest);
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_10 = Catch::clara::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/../ApprovalTests/integrations/catch/Catch2Approvals.h:33:13)>
             ::_M_invoke;
  local_18 = Catch::clara::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/../ApprovalTests/integrations/catch/Catch2Approvals.h:33:13)>
             ::_M_manager;
  ApprovalTests::FrameworkIntegrations::setTestPassedNotification
            ((TestPassedNotification *)&local_28);
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

virtual void testCaseStarting(Catch::TestCaseInfo const& testInfo) override
    {

        currentTest.setFileName(testInfo.lineInfo.file);
        ApprovalTests::FrameworkIntegrations::setCurrentTest(&currentTest);
        ApprovalTests::FrameworkIntegrations::setTestPassedNotification(
            []() { REQUIRE(true); });
    }